

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* args::Wrap(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *in,size_type width,size_type firstlinewidth)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  size_type firstlinewidth_00;
  size_type in_stack_fffffffffffffdc8;
  allocator local_229;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  second;
  undefined1 local_210 [48];
  undefined1 local_1e0 [8];
  _Alloc_hider local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  bool local_1b8;
  istringstream stream;
  
  uVar4 = std::__cxx11::string::find((char)in,10);
  if (uVar4 == 0xffffffffffffffff) {
    std::__cxx11::istringstream::istringstream((istringstream *)&stream,(string *)in,_S_in);
    pcVar1 = (in->_M_dataplus)._M_p;
    sVar2 = in->_M_string_length;
    sVar5 = 0;
    while ((firstlinewidth_00 = sVar2, sVar2 != sVar5 &&
           (iVar3 = isspace((uint)(byte)pcVar1[sVar5]), firstlinewidth_00 = sVar5, iVar3 != 0))) {
      sVar5 = sVar5 + 1;
    }
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                        *)local_210,(istream_type *)&stream);
    local_1e0 = (undefined1  [8])0x0;
    local_1d8._M_p = (pointer)&local_1c8;
    local_1d0 = 0;
    local_1c8._M_local_buf[0] = '\0';
    local_1b8 = false;
    Wrap<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>>
              (__return_storage_ptr__,(args *)local_210,
               (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                *)local_1e0,
               (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                *)width,firstlinewidth,firstlinewidth_00,in_stack_fffffffffffffdc8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)(local_210 + 8));
    std::__cxx11::istringstream::~istringstream((istringstream *)&stream);
  }
  else {
    std::__cxx11::string::string((string *)&stream,(string *)in,0,uVar4);
    Wrap(__return_storage_ptr__,(string *)&stream,width,0);
    std::__cxx11::string::~string((string *)&stream);
    std::__cxx11::string::string((string *)&stream,(string *)in,uVar4 + 1,&local_229);
    Wrap(&second,(string *)&stream,width,0);
    std::__cxx11::string::~string((string *)&stream);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                )second.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                )second.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&second);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> Wrap(const std::string &in, const std::string::size_type width, std::string::size_type firstlinewidth = 0)
    {
        // Preserve existing line breaks
        const auto newlineloc = in.find('\n');
        if (newlineloc != in.npos)
        {
            auto first = Wrap(std::string(in, 0, newlineloc), width);
            auto second = Wrap(std::string(in, newlineloc + 1), width);
            first.insert(
                std::end(first),
                std::make_move_iterator(std::begin(second)),
                std::make_move_iterator(std::end(second)));
            return first;
        }

        std::istringstream stream(in);
        std::string::size_type indent = 0;

        for (auto c : in)
        {
            if (!std::isspace(static_cast<unsigned char>(c)))
            {
                break;
            }
            ++indent;
        }

        return Wrap(std::istream_iterator<std::string>(stream), std::istream_iterator<std::string>(),
                    width, firstlinewidth, indent);
    }